

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_0.cpp
# Opt level: O0

void __thiscall
ParserTransform_attemptToParseCellml1XModelWith20Parser_Test::
~ParserTransform_attemptToParseCellml1XModelWith20Parser_Test
          (ParserTransform_attemptToParseCellml1XModelWith20Parser_Test *this)

{
  ParserTransform_attemptToParseCellml1XModelWith20Parser_Test *this_local;
  
  ~ParserTransform_attemptToParseCellml1XModelWith20Parser_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTransform, attemptToParseCellml1XModelWith20Parser)
{
    const std::string e = "Given model is a CellML 1.1 model but strict parsing mode is on.";
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/1.1#\" name=\"name\"/>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(in);

    EXPECT_EQ("", model->name());
    EXPECT_EQ(size_t(1), parser->issueCount());
    EXPECT_EQ(libcellml::Issue::Level::ERROR, parser->issue(0)->level());
    EXPECT_EQ(e, parser->issue(0)->description());
}